

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

void http_parser_pause_(http_parser *parser,int paused)

{
  byte bVar1;
  int paused_local;
  http_parser *parser_local;
  
  if (((parser->field_0x17 & 0x7f) != 0) && ((parser->field_0x17 & 0x7f) != 0x1c)) {
    __assert_fail("0 && \"Attempting to pause parser in error state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/http_parser/http_parser.c"
                  ,0x881,"void http_parser_pause_(http_parser *, int)");
  }
  bVar1 = 0;
  if (paused != 0) {
    bVar1 = 0x1c;
  }
  parser->field_0x17 = parser->field_0x17 & 0x80 | bVar1;
  return;
}

Assistant:

void
http_parser_pause_(http_parser *parser, int paused) {
  /* Users should only be pausing/unpausing a parser that is not in an error
   * state. In non-debug builds, there's not much that we can do about this
   * other than ignore it.
   */
  if (HTTP_PARSER_ERRNO(parser) == HPE_OK ||
      HTTP_PARSER_ERRNO(parser) == HPE_PAUSED) {
    SET_ERRNO((paused) ? HPE_PAUSED : HPE_OK);
  } else {
    assert(0 && "Attempting to pause parser in error state");
  }
}